

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O2

void __thiscall
Assimp::X3DImporter::XML_ReadNode_GetAttrVal_AsArrF
          (X3DImporter *this,int pAttrIdx,vector<float,_std::allocator<float>_> *pValue)

{
  FIReader *pFVar1;
  pointer pfVar2;
  int iVar3;
  undefined4 extraout_var;
  size_t sVar4;
  double dVar5;
  WordIterator wordItBegin;
  shared_ptr<const_Assimp::FIFloatValue> floatValue;
  float local_5c;
  WordIterator local_58;
  shared_ptr<const_Assimp::FIValue> local_48;
  WordIterator local_38;
  char *__s;
  
  pFVar1 = (this->mReader)._M_t.
           super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
           super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
           super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
  (*(pFVar1->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[0x12])
            (&local_58,pFVar1,pAttrIdx);
  std::dynamic_pointer_cast<Assimp::FIFloatValue_const,Assimp::FIValue_const>(&local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_58.end_);
  if (local_48.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    pFVar1 = (this->mReader)._M_t.
             super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
             super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
             super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
    iVar3 = (*(pFVar1->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                      (pFVar1,pAttrIdx);
    __s = (char *)CONCAT44(extraout_var,iVar3);
    pfVar2 = (pValue->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((pValue->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
        _M_finish != pfVar2) {
      (pValue->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_finish = pfVar2;
    }
    sVar4 = strlen(__s);
    WordIterator::WordIterator(&local_58,__s,__s + sVar4);
    local_38.start_ = local_58.start_;
    local_38.end_ = local_58.end_;
    while (local_38.start_ != (char *)0x0) {
      dVar5 = atof(local_38.start_);
      local_5c = (float)dVar5;
      std::vector<float,_std::allocator<float>_>::emplace_back<float>(pValue,&local_5c);
      WordIterator::operator++(&local_38);
    }
  }
  else {
    std::vector<float,_std::allocator<float>_>::operator=
              (pValue,(vector<float,_std::allocator<float>_> *)
                      (local_48.
                       super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                      + 1));
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_48.super___shared_ptr<const_Assimp::FIValue,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void X3DImporter::XML_ReadNode_GetAttrVal_AsArrF(const int pAttrIdx, std::vector<float>& pValue)
{
    auto floatValue = std::dynamic_pointer_cast<const FIFloatValue>(mReader->getAttributeEncodedValue(pAttrIdx));
    if (floatValue) {
        pValue = floatValue->value;
    }
    else {
        const char *val = mReader->getAttributeValue(pAttrIdx);
        pValue.clear();

        //std::cregex_iterator wordItBegin(val, val + strlen(val), pattern_nws);
        //const std::cregex_iterator wordItEnd;
        //std::transform(wordItBegin, wordItEnd, std::back_inserter(pValue), [](const std::cmatch &match) { return std::stof(match.str()); });

        WordIterator wordItBegin(val, val + strlen(val));
        WordIterator wordItEnd;
        std::transform(wordItBegin, wordItEnd, std::back_inserter(pValue), [](const char *match) { return static_cast<float>(atof(match)); });
    }
}